

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_ManTimeDup(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  void **ppvVar1;
  void **ppvVar2;
  Abc_Time_t *pAVar3;
  int iVar4;
  int iVar5;
  Abc_ManTime_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Time_t *pAVar9;
  int local_34;
  int i;
  Abc_Time_t **ppTimesNew;
  Abc_Time_t **ppTimesOld;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtkOld_local;
  
  if (pNtkOld->pManTime != (Abc_ManTime_t *)0x0) {
    iVar4 = Abc_NtkCiNum(pNtkOld);
    iVar5 = Abc_NtkCiNum(pNtkNew);
    if (iVar4 != iVar5) {
      __assert_fail("Abc_NtkCiNum(pNtkOld) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x21e,"void Abc_ManTimeDup(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar4 = Abc_NtkCoNum(pNtkOld);
    iVar5 = Abc_NtkCoNum(pNtkNew);
    if (iVar4 != iVar5) {
      __assert_fail("Abc_NtkCoNum(pNtkOld) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x21f,"void Abc_ManTimeDup(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar4 = Abc_NtkLatchNum(pNtkOld);
    iVar5 = Abc_NtkLatchNum(pNtkNew);
    if (iVar4 != iVar5) {
      __assert_fail("Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x220,"void Abc_ManTimeDup(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pAVar6 = Abc_ManTimeStart(pNtkNew);
    pNtkNew->pManTime = pAVar6;
    pAVar6 = pNtkNew->pManTime;
    iVar4 = Abc_NtkObjNumMax(pNtkNew);
    Abc_ManTimeExpand(pAVar6,iVar4,0);
    pNtkNew->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
    pNtkNew->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
    ppvVar1 = pNtkOld->pManTime->vArrs->pArray;
    ppvVar2 = pNtkNew->pManTime->vArrs->pArray;
    for (local_34 = 0; iVar4 = Abc_NtkCiNum(pNtkOld), local_34 < iVar4; local_34 = local_34 + 1) {
      pAVar7 = Abc_NtkCi(pNtkOld,local_34);
      pAVar8 = Abc_NtkCi(pNtkNew,local_34);
      *(undefined8 *)ppvVar2[pAVar8->Id] = *ppvVar1[pAVar7->Id];
    }
    ppvVar1 = pNtkOld->pManTime->vReqs->pArray;
    ppvVar2 = pNtkNew->pManTime->vReqs->pArray;
    for (local_34 = 0; iVar4 = Abc_NtkCoNum(pNtkOld), local_34 < iVar4; local_34 = local_34 + 1) {
      pAVar7 = Abc_NtkCo(pNtkOld,local_34);
      pAVar8 = Abc_NtkCo(pNtkNew,local_34);
      *(undefined8 *)ppvVar2[pAVar8->Id] = *ppvVar1[pAVar7->Id];
    }
    pNtkNew->pManTime->tInDriveDef = pNtkOld->pManTime->tInDriveDef;
    pNtkNew->pManTime->tOutLoadDef = pNtkOld->pManTime->tOutLoadDef;
    if (pNtkOld->pManTime->tInDrive != (Abc_Time_t *)0x0) {
      iVar4 = Abc_NtkCiNum(pNtkOld);
      pAVar9 = (Abc_Time_t *)malloc((long)iVar4 << 3);
      pNtkNew->pManTime->tInDrive = pAVar9;
      pAVar9 = pNtkNew->pManTime->tInDrive;
      pAVar3 = pNtkOld->pManTime->tInDrive;
      iVar4 = Abc_NtkCiNum(pNtkOld);
      memcpy(pAVar9,pAVar3,(long)iVar4 << 3);
    }
    if (pNtkOld->pManTime->tOutLoad != (Abc_Time_t *)0x0) {
      iVar4 = Abc_NtkCiNum(pNtkOld);
      pAVar9 = (Abc_Time_t *)malloc((long)iVar4 << 3);
      pNtkNew->pManTime->tOutLoad = pAVar9;
      pAVar9 = pNtkNew->pManTime->tOutLoad;
      pAVar3 = pNtkOld->pManTime->tOutLoad;
      iVar4 = Abc_NtkCoNum(pNtkOld);
      memcpy(pAVar9,pAVar3,(long)iVar4 << 3);
    }
  }
  return;
}

Assistant:

void Abc_ManTimeDup( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    extern void Abc_NtkTimePrint( Abc_Ntk_t * pNtk );

    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimesOld, ** ppTimesNew;
    int i;
    if ( pNtkOld->pManTime == NULL )
        return;
    assert( Abc_NtkCiNum(pNtkOld) == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtkOld) == Abc_NtkCoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew) );
    // create the new timing manager
    pNtkNew->pManTime = Abc_ManTimeStart(pNtkNew);
    Abc_ManTimeExpand( pNtkNew->pManTime, Abc_NtkObjNumMax(pNtkNew), 0 );
    // set the default timing
    pNtkNew->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
    pNtkNew->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
    // set the CI timing
    ppTimesOld = (Abc_Time_t **)pNtkOld->pManTime->vArrs->pArray;
    ppTimesNew = (Abc_Time_t **)pNtkNew->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtkOld, pObj, i )
        *ppTimesNew[ Abc_NtkCi(pNtkNew,i)->Id ] = *ppTimesOld[ pObj->Id ];
    // set the CO timing
    ppTimesOld = (Abc_Time_t **)pNtkOld->pManTime->vReqs->pArray;
    ppTimesNew = (Abc_Time_t **)pNtkNew->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtkOld, pObj, i )
        *ppTimesNew[ Abc_NtkCo(pNtkNew,i)->Id ] = *ppTimesOld[ pObj->Id ];
    // duplicate input drive
    pNtkNew->pManTime->tInDriveDef = pNtkOld->pManTime->tInDriveDef; 
    pNtkNew->pManTime->tOutLoadDef = pNtkOld->pManTime->tOutLoadDef; 
    if ( pNtkOld->pManTime->tInDrive )
    {
        pNtkNew->pManTime->tInDrive = ABC_ALLOC( Abc_Time_t, Abc_NtkCiNum(pNtkOld) );
        memcpy( pNtkNew->pManTime->tInDrive, pNtkOld->pManTime->tInDrive, sizeof(Abc_Time_t) * Abc_NtkCiNum(pNtkOld) );
    }
    if ( pNtkOld->pManTime->tOutLoad )
    {
        pNtkNew->pManTime->tOutLoad = ABC_ALLOC( Abc_Time_t, Abc_NtkCiNum(pNtkOld) );
        memcpy( pNtkNew->pManTime->tOutLoad, pNtkOld->pManTime->tOutLoad, sizeof(Abc_Time_t) * Abc_NtkCoNum(pNtkOld) );
    }
}